

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_scalar_plt
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,REF_BOOL as_brick,
          char *filename)

{
  double dVar1;
  REF_GLOB *pRVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  uint uVar5;
  uint uVar6;
  FILE *__s;
  size_t sVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  REF_MPI pRVar14;
  long lVar15;
  int iVar16;
  REF_MPI pRVar17;
  undefined4 in_register_00000034;
  char *pcVar18;
  ulong uVar19;
  REF_GRID ref_grid_00;
  size_t sVar20;
  long lVar21;
  double dVar22;
  REF_GLOB *pRVar23;
  size_t sStackY_1640;
  REF_GLOB nnode;
  REF_LONG ncell;
  float zonemarker;
  REF_GLOB *l2c;
  double solutiontime;
  int notused;
  int strandid;
  int parentzone;
  int len_1;
  int numpts;
  double *local_15e0;
  REF_GRID local_15d8;
  int celldim;
  int numelements;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  REF_MPI local_15b8;
  ulong local_15b0;
  int local_15a4;
  double *local_15a0;
  REF_MPI local_1598;
  REF_MPI local_1590;
  int len;
  undefined4 local_1584;
  double *local_1580;
  int local_1574;
  REF_INT max_faceid;
  REF_INT min_faceid;
  ulong local_1568;
  long local_1560;
  REF_CELL local_1558;
  REF_MPI local_1550;
  float eohmarker;
  int numvar;
  int filetype;
  int one;
  char zonename [256];
  char default_name [1000];
  int ascii [1024];
  
  local_15b0 = CONCAT44(in_register_00000034,ldim);
  local_1580 = (double *)CONCAT44(local_1580._4_4_,as_brick);
  pRVar14 = ref_grid->mpi;
  pRVar3 = ref_grid->node;
  one = 1;
  filetype = 0;
  numvar = ldim + 3;
  eohmarker = 357.0;
  if (0 < pRVar14->timing) {
    ref_mpi_stopwatch_stop(pRVar14,"reset timing");
  }
  uVar5 = ref_node_synchronize_globals(pRVar3);
  if (uVar5 != 0) {
    sStackY_1640 = (size_t)uVar5;
    pcVar18 = "sync";
    uVar9 = 0x10a0;
    goto LAB_001a698d;
  }
  if (0 < pRVar14->timing) {
    ref_mpi_stopwatch_stop(pRVar14,"header sync global");
  }
  if (pRVar14->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x10a7,"ref_gather_scalar_plt","unable to open file");
      return 2;
    }
    sVar7 = fwrite("#!TDV112",1,8,__s);
    if (sVar7 == 8) {
      sVar7 = fwrite(&one,4,1,__s);
      if (sVar7 == 1) {
        sVar7 = fwrite(&filetype,4,1,__s);
        if (sVar7 == 1) {
          ascii[0] = 0x66;
          ascii[1] = 0x74;
          ascii[2] = 0;
          sVar7 = fwrite(ascii,4,3,__s);
          if (sVar7 == 3) {
            sVar7 = fwrite(&numvar,4,1,__s);
            if (sVar7 == 1) {
              ascii[0] = 0x78;
              ascii[1] = 0;
              sVar7 = fwrite(ascii,4,2,__s);
              if (sVar7 == 2) {
                ascii[0] = 0x79;
                ascii[1] = 0;
                sVar7 = fwrite(ascii,4,2,__s);
                if (sVar7 == 2) {
                  ascii[0] = 0x7a;
                  ascii[1] = 0;
                  sVar7 = fwrite(ascii,4,2,__s);
                  if (sVar7 == 2) {
                    uVar8 = 0;
                    if (0 < (int)local_15b0) {
                      uVar8 = local_15b0 & 0xffffffff;
                    }
                    uVar19 = 0;
                    local_15e0 = scalar;
                    do {
                      scalar = local_15e0;
                      if (uVar19 == uVar8) goto LAB_001a69ca;
                      len = 0;
                      if (scalar_names == (char **)0x0) {
                        snprintf(default_name,1000,"V%d",uVar19 + 1 & 0xffffffff);
                        uVar5 = ref_gather_plt_char_int(default_name,0x400,&len,ascii);
                        if (uVar5 != 0) {
                          sStackY_1640 = (size_t)uVar5;
                          pcVar18 = "a2i";
                          uVar9 = 0x10c1;
                          goto LAB_001a698d;
                        }
                      }
                      else {
                        uVar5 = ref_gather_plt_char_int(scalar_names[uVar19],0x400,&len,ascii);
                        if (uVar5 != 0) {
                          sStackY_1640 = (size_t)uVar5;
                          pcVar18 = "a2i";
                          uVar9 = 0x10c3;
                          goto LAB_001a698d;
                        }
                      }
                      uVar19 = uVar19 + 1;
                      sStackY_1640 = (size_t)len;
                      sVar7 = fwrite(ascii,4,sStackY_1640,__s);
                    } while (sVar7 == sStackY_1640);
                    pcVar18 = "var";
                    uVar9 = 0x10c5;
                  }
                  else {
                    pcVar18 = "var";
                    sStackY_1640 = 2;
                    uVar9 = 0x10bb;
                  }
                }
                else {
                  pcVar18 = "var";
                  sStackY_1640 = 2;
                  uVar9 = 0x10b8;
                }
              }
              else {
                pcVar18 = "var";
                sStackY_1640 = 2;
                uVar9 = 0x10b5;
              }
            }
            else {
              pcVar18 = "numvar";
              sStackY_1640 = 1;
              uVar9 = 0x10b2;
            }
          }
          else {
            pcVar18 = "title";
            sStackY_1640 = 3;
            uVar9 = 0x10b0;
          }
        }
        else {
          pcVar18 = "filetype";
          sStackY_1640 = 1;
          uVar9 = 0x10ab;
        }
      }
      else {
        pcVar18 = "magic";
        sStackY_1640 = 1;
        uVar9 = 0x10aa;
      }
    }
    else {
      pcVar18 = "header";
      sStackY_1640 = 8;
      uVar9 = 0x10a9;
    }
    goto LAB_001a8031;
  }
  __s = (FILE *)0x0;
LAB_001a69ca:
  if (0 < pRVar14->timing) {
    ref_mpi_stopwatch_stop(pRVar14,"header vars");
  }
  uVar5 = ref_grid_faceid_range(ref_grid,&min_faceid,&max_faceid);
  if (uVar5 != 0) {
    sStackY_1640 = (size_t)uVar5;
    pcVar18 = "range";
    uVar9 = 0x10cb;
    goto LAB_001a698d;
  }
  uVar5 = min_faceid;
  local_15e0 = scalar;
  local_15d8 = ref_grid;
  local_1590 = pRVar14;
  if (0 < pRVar14->timing) {
    ref_mpi_stopwatch_stop(pRVar14,"header faceid range");
    uVar5 = min_faceid;
  }
  while( true ) {
    pRVar14 = local_1590;
    if (max_faceid < (int)uVar5) break;
    pRVar14 = local_15d8->mpi;
    parentzone = -1;
    strandid = -1;
    solutiontime = 0.0;
    notused = -1;
    datapacking = 0;
    varloc = 0;
    faceneighbors = 0;
    zonemarker = 299.0;
    celldim = 0;
    local_1584 = 0;
    zonetype = 2;
    uVar6 = ref_grid_compact_cell_id_nodes(local_15d8,local_15d8->cell[3],uVar5,&nnode,&ncell,&l2c);
    if (uVar6 != 0) {
      pcVar18 = "l2c";
      uVar9 = 0xe3f;
LAB_001a73f5:
      sStackY_1640 = (size_t)uVar6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_plt_tri_header",sStackY_1640,pcVar18);
LAB_001a7bdb:
      pcVar18 = "plt tri header";
      uVar9 = 0x10d0;
      goto LAB_001a698d;
    }
    if (0 < ncell && 0 < nnode) {
      if ((ulong)nnode < 0x80000000) {
        numpts = (int)nnode;
        if (0x7fffffff < (ulong)ncell) {
          pcVar18 = "too many tri for int";
          uVar9 = 0xe47;
          goto LAB_001a74a9;
        }
        numelements = (int)ncell;
        if (pRVar14->id != 0) goto LAB_001a6f97;
        sVar7 = fwrite(&zonemarker,4,1,__s);
        if (sVar7 == 1) {
          snprintf(zonename,0x100,"tri%d",(ulong)uVar5);
          uVar6 = ref_gather_plt_char_int(zonename,0x100,&len_1,(REF_INT *)default_name);
          if (uVar6 != 0) {
            pcVar18 = "a2i";
            uVar9 = 0xe4e;
            goto LAB_001a73f5;
          }
          sVar20 = (size_t)len_1;
          sVar7 = fwrite(default_name,4,sVar20,__s);
          if (sVar7 == sVar20) {
            sVar7 = fwrite(&parentzone,4,1,__s);
            if (sVar7 == 1) {
              sVar7 = fwrite(&strandid,4,1,__s);
              if (sVar7 == 1) {
                sVar7 = fwrite(&solutiontime,8,1,__s);
                if (sVar7 == 1) {
                  sVar7 = fwrite(&notused,4,1,__s);
                  if (sVar7 == 1) {
                    sVar7 = fwrite(&zonetype,4,1,__s);
                    if (sVar7 == 1) {
                      sVar7 = fwrite(&datapacking,4,1,__s);
                      if (sVar7 == 1) {
                        sVar7 = fwrite(&varloc,4,1,__s);
                        if (sVar7 == 1) {
                          sVar7 = fwrite(&faceneighbors,4,1,__s);
                          if (sVar7 == 1) {
                            sVar7 = fwrite(&numpts,4,1,__s);
                            if (sVar7 == 1) {
                              sVar7 = fwrite(&numelements,4,1,__s);
                              if (sVar7 == 1) {
                                sVar7 = fwrite(&celldim,4,1,__s);
                                if (sVar7 == 1) {
                                  sVar7 = fwrite(&celldim,4,1,__s);
                                  if (sVar7 == 1) {
                                    sVar7 = fwrite(&celldim,4,1,__s);
                                    if (sVar7 == 1) {
                                      sVar7 = fwrite(&local_1584,4,1,__s);
                                      if (sVar7 == 1) goto LAB_001a6f97;
                                      pcVar18 = "int";
                                      sVar20 = 1;
                                      uVar9 = 0xe5e;
                                    }
                                    else {
                                      pcVar18 = "int";
                                      sVar20 = 1;
                                      uVar9 = 0xe5d;
                                    }
                                  }
                                  else {
                                    pcVar18 = "int";
                                    sVar20 = 1;
                                    uVar9 = 0xe5c;
                                  }
                                }
                                else {
                                  pcVar18 = "int";
                                  sVar20 = 1;
                                  uVar9 = 0xe5b;
                                }
                              }
                              else {
                                pcVar18 = "int";
                                sVar20 = 1;
                                uVar9 = 0xe5a;
                              }
                            }
                            else {
                              pcVar18 = "int";
                              sVar20 = 1;
                              uVar9 = 0xe59;
                            }
                          }
                          else {
                            pcVar18 = "int";
                            sVar20 = 1;
                            uVar9 = 0xe58;
                          }
                        }
                        else {
                          pcVar18 = "int";
                          sVar20 = 1;
                          uVar9 = 0xe57;
                        }
                      }
                      else {
                        pcVar18 = "int";
                        sVar20 = 1;
                        uVar9 = 0xe56;
                      }
                    }
                    else {
                      pcVar18 = "int";
                      sVar20 = 1;
                      uVar9 = 0xe55;
                    }
                  }
                  else {
                    pcVar18 = "int";
                    sVar20 = 1;
                    uVar9 = 0xe54;
                  }
                }
                else {
                  pcVar18 = "double";
                  sVar20 = 1;
                  uVar9 = 0xe53;
                }
              }
              else {
                pcVar18 = "int";
                sVar20 = 1;
                uVar9 = 0xe52;
              }
            }
            else {
              pcVar18 = "int";
              sVar20 = 1;
              uVar9 = 0xe51;
            }
          }
          else {
            pcVar18 = "title";
            uVar9 = 0xe4f;
          }
        }
        else {
          pcVar18 = "zonemarker";
          sVar20 = 1;
          uVar9 = 0xe4b;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tri_header",pcVar18,sVar20,sVar7);
      }
      else {
        pcVar18 = "too many nodes for int";
        uVar9 = 0xe45;
LAB_001a74a9:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tri_header",pcVar18);
      }
      sStackY_1640 = 1;
      goto LAB_001a7bdb;
    }
LAB_001a6f97:
    free(l2c);
    pRVar14 = local_15d8->mpi;
    parentzone = -1;
    strandid = -1;
    solutiontime = 0.0;
    notused = -1;
    datapacking = 0;
    varloc = 0;
    faceneighbors = 0;
    zonemarker = 299.0;
    celldim = 0;
    local_1584 = 0;
    zonetype = 3;
    uVar6 = ref_grid_compact_cell_id_nodes(local_15d8,local_15d8->cell[6],uVar5,&nnode,&ncell,&l2c);
    if (uVar6 != 0) {
      pcVar18 = "l2c";
      uVar9 = 0xe80;
LAB_001a7428:
      sStackY_1640 = (size_t)uVar6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_plt_qua_header",sStackY_1640,pcVar18);
LAB_001a7ce4:
      pcVar18 = "plt qua header";
      uVar9 = 0x10d1;
      goto LAB_001a698d;
    }
    if (0 < ncell && 0 < nnode) {
      if ((ulong)nnode < 0x80000000) {
        numpts = (int)nnode;
        if (0x7fffffff < (ulong)ncell) {
          pcVar18 = "too many qua for int";
          uVar9 = 0xe88;
          goto LAB_001a74f9;
        }
        numelements = (int)ncell;
        if (pRVar14->id != 0) goto LAB_001a7280;
        sVar7 = fwrite(&zonemarker,4,1,__s);
        if (sVar7 == 1) {
          snprintf(zonename,0x100,"qua%d",(ulong)uVar5);
          uVar6 = ref_gather_plt_char_int(zonename,0x100,&len_1,(REF_INT *)default_name);
          if (uVar6 != 0) {
            pcVar18 = "a2i";
            uVar9 = 0xe8f;
            goto LAB_001a7428;
          }
          sVar20 = (size_t)len_1;
          sVar7 = fwrite(default_name,4,sVar20,__s);
          if (sVar7 == sVar20) {
            sVar7 = fwrite(&parentzone,4,1,__s);
            if (sVar7 == 1) {
              sVar7 = fwrite(&strandid,4,1,__s);
              if (sVar7 == 1) {
                sVar7 = fwrite(&solutiontime,8,1,__s);
                if (sVar7 == 1) {
                  sVar7 = fwrite(&notused,4,1,__s);
                  if (sVar7 == 1) {
                    sVar7 = fwrite(&zonetype,4,1,__s);
                    if (sVar7 == 1) {
                      sVar7 = fwrite(&datapacking,4,1,__s);
                      if (sVar7 == 1) {
                        sVar7 = fwrite(&varloc,4,1,__s);
                        if (sVar7 == 1) {
                          sVar7 = fwrite(&faceneighbors,4,1,__s);
                          if (sVar7 == 1) {
                            sVar7 = fwrite(&numpts,4,1,__s);
                            if (sVar7 == 1) {
                              sVar7 = fwrite(&numelements,4,1,__s);
                              if (sVar7 == 1) {
                                sVar7 = fwrite(&celldim,4,1,__s);
                                if (sVar7 == 1) {
                                  sVar7 = fwrite(&celldim,4,1,__s);
                                  if (sVar7 == 1) {
                                    sVar7 = fwrite(&celldim,4,1,__s);
                                    if (sVar7 == 1) {
                                      sVar7 = fwrite(&local_1584,4,1,__s);
                                      if (sVar7 == 1) goto LAB_001a7280;
                                      pcVar18 = "int";
                                      sVar20 = 1;
                                      uVar9 = 0xe9f;
                                    }
                                    else {
                                      pcVar18 = "int";
                                      sVar20 = 1;
                                      uVar9 = 0xe9e;
                                    }
                                  }
                                  else {
                                    pcVar18 = "int";
                                    sVar20 = 1;
                                    uVar9 = 0xe9d;
                                  }
                                }
                                else {
                                  pcVar18 = "int";
                                  sVar20 = 1;
                                  uVar9 = 0xe9c;
                                }
                              }
                              else {
                                pcVar18 = "int";
                                sVar20 = 1;
                                uVar9 = 0xe9b;
                              }
                            }
                            else {
                              pcVar18 = "int";
                              sVar20 = 1;
                              uVar9 = 0xe9a;
                            }
                          }
                          else {
                            pcVar18 = "int";
                            sVar20 = 1;
                            uVar9 = 0xe99;
                          }
                        }
                        else {
                          pcVar18 = "int";
                          sVar20 = 1;
                          uVar9 = 0xe98;
                        }
                      }
                      else {
                        pcVar18 = "int";
                        sVar20 = 1;
                        uVar9 = 0xe97;
                      }
                    }
                    else {
                      pcVar18 = "int";
                      sVar20 = 1;
                      uVar9 = 0xe96;
                    }
                  }
                  else {
                    pcVar18 = "int";
                    sVar20 = 1;
                    uVar9 = 0xe95;
                  }
                }
                else {
                  pcVar18 = "double";
                  sVar20 = 1;
                  uVar9 = 0xe94;
                }
              }
              else {
                pcVar18 = "int";
                sVar20 = 1;
                uVar9 = 0xe93;
              }
            }
            else {
              pcVar18 = "int";
              sVar20 = 1;
              uVar9 = 0xe92;
            }
          }
          else {
            pcVar18 = "title";
            uVar9 = 0xe90;
          }
        }
        else {
          pcVar18 = "zonemarker";
          sVar20 = 1;
          uVar9 = 0xe8c;
        }
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_qua_header",pcVar18,sVar20,sVar7);
      }
      else {
        pcVar18 = "too many nodes for int";
        uVar9 = 0xe86;
LAB_001a74f9:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_qua_header",pcVar18);
      }
      sStackY_1640 = 1;
      goto LAB_001a7ce4;
    }
LAB_001a7280:
    free(l2c);
    uVar5 = uVar5 + 1;
  }
  if (0 < local_1590->timing) {
    ref_mpi_stopwatch_stop(local_1590,"header surf");
  }
  ref_grid_00 = local_15d8;
  if ((int)local_1580 != 0) {
    uVar5 = ref_gather_plt_brick_header(local_15d8,local_15d8->cell[8],(FILE *)__s);
    if (uVar5 != 0) {
      sStackY_1640 = (size_t)uVar5;
      pcVar18 = "plt tet brick header";
      uVar9 = 0x10d7;
      goto LAB_001a698d;
    }
LAB_001a773a:
    uVar5 = ref_gather_plt_brick_header(ref_grid_00,ref_grid_00->cell[9],(FILE *)__s);
    if (uVar5 != 0) {
      sStackY_1640 = (size_t)uVar5;
      pcVar18 = "plt pyr brick header";
      uVar9 = 0x10dc;
      goto LAB_001a698d;
    }
    uVar5 = ref_gather_plt_brick_header(ref_grid_00,ref_grid_00->cell[10],(FILE *)__s);
    if (uVar5 != 0) {
      sStackY_1640 = (size_t)uVar5;
      pcVar18 = "plt pri brick header";
      uVar9 = 0x10de;
      goto LAB_001a698d;
    }
    uVar5 = ref_gather_plt_brick_header(ref_grid_00,ref_grid_00->cell[0xb],(FILE *)__s);
    if (uVar5 != 0) {
      sStackY_1640 = (size_t)uVar5;
      pcVar18 = "plt hex brick header";
      uVar9 = 0x10e0;
      goto LAB_001a698d;
    }
    if (0 < pRVar14->timing) {
      ref_mpi_stopwatch_stop(pRVar14,"header vol");
    }
    if ((pRVar14->id == 0) && (sVar7 = fwrite(&eohmarker,4,1,__s), sVar7 != 1)) {
      pcVar18 = "eohmarker";
      sStackY_1640 = 1;
      uVar9 = 0x10e5;
LAB_001a8031:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_scalar_plt",pcVar18,sStackY_1640,sVar7);
      return 1;
    }
    if (0 < pRVar14->timing) {
      ref_mpi_stopwatch_stop(pRVar14,"plt end of header");
    }
    iVar16 = (int)local_15b0;
    uVar8 = 0xfffffffffffffffd;
    if (-3 < iVar16) {
      uVar8 = local_15b0;
    }
    local_1568 = uVar8 & 0xffffffff;
    local_1550 = (REF_MPI)0x0;
    if (0 < iVar16) {
      local_1550 = (REF_MPI)(local_15b0 & 0xffffffff);
    }
    local_1574 = (int)uVar8 + 4;
    local_1560 = (long)iVar16 << 3;
    sStackY_1640 = 1;
    iVar16 = min_faceid;
    while (iVar16 <= max_faceid) {
      pRVar14 = ref_grid_00->mpi;
      pRVar3 = ref_grid_00->node;
      pRVar4 = ref_grid_00->cell[3];
      parentzone = 0;
      strandid = 0;
      notused = -1;
      len_1 = 0x43958000;
      zonemarker = 2.8026e-45;
      if (1 < pRVar14->timing) {
        ref_mpi_stopwatch_stop(pRVar14,"plt tri start");
      }
      local_1558 = pRVar4;
      uVar5 = ref_grid_compact_cell_id_nodes
                        (ref_grid_00,pRVar4,iVar16,(REF_GLOB *)zonename,(REF_LONG *)default_name,
                         (REF_GLOB **)&solutiontime);
      if (uVar5 != 0) {
        pcVar18 = "l2c";
        uVar9 = 0xf3a;
LAB_001a8e7f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tri_zone",(ulong)uVar5,pcVar18);
        sStackY_1640 = (size_t)uVar5;
LAB_001a93f2:
        pcVar18 = "plt tri zone";
        uVar9 = 0x10ec;
        goto LAB_001a698d;
      }
      local_15a4 = iVar16;
      if ((0 < (long)zonename._0_8_) && (0 < (long)default_name._0_8_)) {
        if (1 < pRVar14->timing) {
          ref_mpi_stopwatch_stop(pRVar14,"plt tri compact");
        }
        local_15b8 = pRVar14;
        if (pRVar14->id != 0) {
LAB_001a82b1:
          if (1 < local_15b8->timing) {
            ref_mpi_stopwatch_stop(local_15b8,"plt tri header");
          }
          pdVar12 = (double *)0x0;
          pRVar14 = (REF_MPI)0x0;
          while (pRVar17 = local_15b8, pRVar14 != (REF_MPI)0x3) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            dVar22 = -1e+200;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            pdVar11 = pdVar12;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar23 = *(REF_GLOB **)((long)pRVar3->real + (long)pdVar11);
                if ((double)pRVar23 <= (double)l2c) {
                  l2c = pRVar23;
                }
                dVar1 = *(double *)((long)pRVar3->real + (long)pdVar11);
                nnode = (REF_GLOB)dVar22;
                ncell = (REF_LONG)l2c;
                if (dVar22 <= dVar1) {
                  dVar22 = dVar1;
                  nnode = (REF_GLOB)dVar1;
                }
              }
              pdVar11 = pdVar11 + 0xf;
            }
            local_15a0 = pdVar12;
            local_1598 = pRVar14;
            uVar5 = ref_mpi_min(local_15b8,&l2c,&ncell,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi min";
              uVar9 = 0xf5a;
              goto LAB_001a8e7f;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar17,&l2c,&nnode,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi max";
              uVar9 = 0xf5c;
              goto LAB_001a8e7f;
            }
            if (pRVar17->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0xf5e;
                goto LAB_001a93eb;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0xf5f;
                goto LAB_001a93eb;
              }
            }
            pdVar12 = local_15a0 + 1;
            pRVar14 = (REF_MPI)((long)&local_1598->n + 1);
          }
          pRVar17 = (REF_MPI)0x0;
          pdVar12 = local_15e0;
          pRVar14 = local_15b8;
          while (pRVar17 != local_1550) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            pRVar23 = (REF_GLOB *)0xe974e718d7d7625a;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            pdVar11 = pdVar12;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar2 = (REF_GLOB *)*pdVar11;
                if ((double)pRVar2 <= (double)l2c) {
                  l2c = pRVar2;
                }
                nnode = (REF_GLOB)pRVar23;
                ncell = (REF_LONG)l2c;
                if ((double)pRVar23 <= (double)pRVar2) {
                  pRVar23 = pRVar2;
                  nnode = (REF_GLOB)pRVar2;
                }
              }
              pdVar11 = (double *)((long)pdVar11 + local_1560);
            }
            local_15a0 = pdVar12;
            local_1598 = pRVar17;
            uVar5 = ref_mpi_min(pRVar14,&l2c,&ncell,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi min";
              uVar9 = 0xf6c;
              goto LAB_001a8e7f;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar14,&l2c,&nnode,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi max";
              uVar9 = 0xf6e;
              goto LAB_001a8e7f;
            }
            if (pRVar14->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0xf70;
                goto LAB_001a93eb;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              pRVar14 = local_15b8;
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0xf71;
                goto LAB_001a93eb;
              }
            }
            pdVar12 = local_15a0 + 1;
            pRVar17 = (REF_MPI)((long)&local_1598->n + 1);
          }
          if (1 < pRVar14->timing) {
            ref_mpi_stopwatch_stop(local_15b8,"plt tri minmax");
          }
          uVar5 = ref_gather_node_tec_block
                            (pRVar3,zonename._0_8_,(REF_GLOB *)solutiontime,(REF_INT)local_15b0,
                             local_15e0,(int)zonemarker,(FILE *)__s);
          if (uVar5 == 0) {
            if (1 < local_15b8->timing) {
              ref_mpi_stopwatch_stop(local_15b8,"plt tri node");
            }
            uVar5 = ref_gather_cell_id_tec
                              (pRVar3,local_1558,local_15a4,default_name._0_8_,
                               (REF_GLOB *)solutiontime,1,(FILE *)__s);
            ref_grid_00 = local_15d8;
            if (uVar5 == 0) {
              if (1 < local_15b8->timing) {
                ref_mpi_stopwatch_stop(local_15b8,"plt tri cell");
              }
              goto LAB_001a867b;
            }
            pcVar18 = "c2n";
            uVar9 = 0xf7f;
          }
          else {
            pcVar18 = "block points";
            uVar9 = 0xf79;
          }
          goto LAB_001a8e7f;
        }
        sVar7 = fwrite(&len_1,4,1,__s);
        iVar16 = local_1574;
        if (sVar7 == 1) {
          while (iVar16 = iVar16 + -1, iVar16 != 0) {
            sVar7 = fwrite(&zonemarker,4,1,__s);
            if (sVar7 != 1) {
              pcVar18 = "int";
              uVar9 = 0xf46;
              goto LAB_001a93eb;
            }
          }
          sVar7 = fwrite(&parentzone,4,1,__s);
          if (sVar7 == 1) {
            sVar7 = fwrite(&strandid,4,1,__s);
            if (sVar7 == 1) {
              sVar7 = fwrite(&notused,4,1,__s);
              if (sVar7 == 1) goto LAB_001a82b1;
              pcVar18 = "int";
              uVar9 = 0xf4b;
            }
            else {
              pcVar18 = "int";
              uVar9 = 0xf4a;
            }
          }
          else {
            pcVar18 = "int";
            uVar9 = 0xf49;
          }
        }
        else {
          pcVar18 = "zonemarker";
          uVar9 = 0xf43;
        }
LAB_001a93eb:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tri_zone",pcVar18,1,sVar7);
        goto LAB_001a93f2;
      }
LAB_001a867b:
      free((void *)solutiontime);
      local_1598 = ref_grid_00->mpi;
      pRVar3 = ref_grid_00->node;
      local_1558 = ref_grid_00->cell[6];
      parentzone = 0;
      len_1 = 0x43958000;
      strandid = 0;
      zonemarker = 2.8026e-45;
      notused = -1;
      uVar5 = ref_grid_compact_cell_id_nodes
                        (ref_grid_00,local_1558,local_15a4,(REF_GLOB *)zonename,
                         (REF_LONG *)default_name,(REF_GLOB **)&solutiontime);
      if (uVar5 != 0) {
        pcVar18 = "l2c";
        uVar9 = 0xf99;
LAB_001a8f8b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_qua_zone",(ulong)uVar5,pcVar18);
        sStackY_1640 = (size_t)uVar5;
LAB_001a94d0:
        pcVar18 = "plt qua zone";
        uVar9 = 0x10ee;
        goto LAB_001a698d;
      }
      if ((0 < (long)zonename._0_8_) && (0 < (long)default_name._0_8_)) {
        if (local_1598->id == 0) {
          sVar7 = fwrite(&len_1,4,1,__s);
          iVar16 = local_1574;
          if (sVar7 == 1) {
            while (iVar16 = iVar16 + -1, iVar16 != 0) {
              sVar7 = fwrite(&zonemarker,4,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "int";
                uVar9 = 0xfa3;
                goto LAB_001a94c5;
              }
            }
            sVar7 = fwrite(&parentzone,4,1,__s);
            if (sVar7 == 1) {
              sVar7 = fwrite(&strandid,4,1,__s);
              if (sVar7 == 1) {
                sVar7 = fwrite(&notused,4,1,__s);
                if (sVar7 == 1) goto LAB_001a87c9;
                pcVar18 = "int";
                uVar9 = 0xfa8;
              }
              else {
                pcVar18 = "int";
                uVar9 = 0xfa7;
              }
            }
            else {
              pcVar18 = "int";
              uVar9 = 0xfa6;
            }
          }
          else {
            pcVar18 = "zonemarker";
            uVar9 = 4000;
          }
LAB_001a94c5:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar9,"ref_gather_plt_qua_zone",pcVar18,1,sVar7);
          sStackY_1640 = 1;
        }
        else {
LAB_001a87c9:
          pRVar14 = local_1598;
          local_15a0 = (double *)0x0;
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            dVar22 = -1e+200;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            pdVar12 = local_15a0;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar23 = *(REF_GLOB **)((long)pRVar3->real + (long)pdVar12);
                if ((double)pRVar23 <= (double)l2c) {
                  l2c = pRVar23;
                }
                dVar1 = *(double *)((long)pRVar3->real + (long)pdVar12);
                nnode = (REF_GLOB)dVar22;
                ncell = (REF_LONG)l2c;
                if (dVar22 <= dVar1) {
                  dVar22 = dVar1;
                  nnode = (REF_GLOB)dVar1;
                }
              }
              pdVar12 = pdVar12 + 0xf;
            }
            uVar5 = ref_mpi_min(pRVar14,&l2c,&ncell,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi min";
              uVar9 = 0xfb5;
              goto LAB_001a8f8b;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar14,&l2c,&nnode,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi max";
              uVar9 = 0xfb7;
              goto LAB_001a8f8b;
            }
            if (pRVar14->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0xfb9;
                goto LAB_001a94c5;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0xfba;
                goto LAB_001a94c5;
              }
            }
            local_15a0 = local_15a0 + 1;
          }
          local_15a0 = local_15e0;
          for (local_15b8 = (REF_MPI)0x0; pRVar14 = local_1598, local_15b8 != local_1550;
              local_15b8 = (REF_MPI)((long)&local_15b8->n + 1)) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            pRVar23 = (REF_GLOB *)0xe974e718d7d7625a;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            pdVar12 = local_15a0;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar2 = (REF_GLOB *)*pdVar12;
                if ((double)pRVar2 <= (double)l2c) {
                  l2c = pRVar2;
                }
                nnode = (REF_GLOB)pRVar23;
                ncell = (REF_LONG)l2c;
                if ((double)pRVar23 <= (double)pRVar2) {
                  pRVar23 = pRVar2;
                  nnode = (REF_GLOB)pRVar2;
                }
              }
              pdVar12 = (double *)((long)pdVar12 + local_1560);
            }
            uVar5 = ref_mpi_min(local_1598,&l2c,&ncell,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi min";
              uVar9 = 0xfc7;
              goto LAB_001a8f8b;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar14,&l2c,&nnode,3);
            if (uVar5 != 0) {
              pcVar18 = "mpi max";
              uVar9 = 0xfc9;
              goto LAB_001a8f8b;
            }
            if (pRVar14->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0xfcb;
                goto LAB_001a94c5;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0xfcc;
                goto LAB_001a94c5;
              }
            }
            local_15a0 = local_15a0 + 1;
          }
          uVar5 = ref_gather_node_tec_block
                            (pRVar3,zonename._0_8_,(REF_GLOB *)solutiontime,(REF_INT)local_15b0,
                             local_15e0,(int)zonemarker,(FILE *)__s);
          if (uVar5 == 0) {
            uVar5 = ref_gather_cell_id_tec
                              (pRVar3,local_1558,local_15a4,default_name._0_8_,
                               (REF_GLOB *)solutiontime,1,(FILE *)__s);
            if (uVar5 == 0) goto LAB_001a8af8;
            pcVar18 = "c2n";
            uVar9 = 0xfd6;
          }
          else {
            pcVar18 = "block points";
            uVar9 = 0xfd2;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar9,"ref_gather_plt_qua_zone",(ulong)uVar5,pcVar18);
          sStackY_1640 = (size_t)uVar5;
        }
        goto LAB_001a94d0;
      }
LAB_001a8af8:
      free((void *)solutiontime);
      pRVar14 = local_1590;
      ref_grid_00 = local_15d8;
      iVar16 = local_15a4 + 1;
    }
    if (0 < pRVar14->timing) {
      ref_mpi_stopwatch_stop(local_1590,"surf zone");
    }
    if ((int)local_1580 == 0) {
      pRVar14 = local_15d8->mpi;
      pRVar3 = local_15d8->node;
      pRVar4 = local_15d8->cell[8];
      parentzone = 0;
      strandid = 0;
      notused = -1;
      len_1 = 0x43958000;
      zonemarker = 2.8026e-45;
      if (1 < pRVar14->timing) {
        ref_mpi_stopwatch_stop(pRVar14,"plt tet start");
      }
      uVar5 = ref_grid_compact_cell_nodes
                        (local_15d8,pRVar4,(REF_GLOB *)zonename,(REF_LONG *)default_name,
                         (REF_GLOB **)&solutiontime);
      if (uVar5 == 0) {
        if (((long)zonename._0_8_ < 1) || ((long)default_name._0_8_ < 1)) {
LAB_001a9c07:
          free((void *)solutiontime);
          goto LAB_001a9c11;
        }
        if (1 < pRVar14->timing) {
          ref_mpi_stopwatch_stop(pRVar14,"plt tet compact");
        }
        if (pRVar14->id != 0) {
LAB_001a91de:
          lVar15 = 0;
          for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            dVar22 = -1e+200;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            lVar13 = lVar15;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar23 = *(REF_GLOB **)((long)pRVar3->real + lVar13);
                if ((double)pRVar23 <= (double)l2c) {
                  l2c = pRVar23;
                }
                dVar1 = *(double *)((long)pRVar3->real + lVar13);
                nnode = (REF_GLOB)dVar22;
                ncell = (REF_LONG)l2c;
                if (dVar22 <= dVar1) {
                  dVar22 = dVar1;
                  nnode = (REF_GLOB)dVar1;
                }
              }
              lVar13 = lVar13 + 0x78;
            }
            uVar5 = ref_mpi_min(pRVar14,&l2c,&ncell,3);
            if (uVar5 != 0) {
              sStackY_1640 = (size_t)uVar5;
              pcVar18 = "mpi min";
              uVar9 = 0x100e;
              goto LAB_001a902f;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar14,&l2c,&nnode,3);
            if (uVar5 != 0) {
              sStackY_1640 = (size_t)uVar5;
              pcVar18 = "mpi max";
              uVar9 = 0x1010;
              goto LAB_001a902f;
            }
            if (pRVar14->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0x1012;
                goto LAB_001a9bb4;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0x1013;
                goto LAB_001a9bb4;
              }
            }
            lVar15 = lVar15 + 8;
          }
          local_1580 = local_15e0;
          for (pRVar17 = (REF_MPI)0x0; pRVar17 != local_1550;
              pRVar17 = (REF_MPI)((long)&pRVar17->n + 1)) {
            ncell = 0x6974e718d7d7625a;
            nnode = -0x168b18e728289da6;
            uVar8 = (ulong)(uint)pRVar3->max;
            if (pRVar3->max < 1) {
              uVar8 = 0;
            }
            pRVar23 = (REF_GLOB *)0xe974e718d7d7625a;
            l2c = (REF_GLOB *)0x6974e718d7d7625a;
            pdVar12 = local_1580;
            for (uVar19 = 0; uVar8 != uVar19; uVar19 = uVar19 + 1) {
              if ((*(long *)((long)solutiontime + uVar19 * 8) != -1) &&
                 (pRVar3->ref_mpi->id == pRVar3->part[uVar19])) {
                pRVar2 = (REF_GLOB *)*pdVar12;
                if ((double)pRVar2 <= (double)l2c) {
                  l2c = pRVar2;
                }
                nnode = (REF_GLOB)pRVar23;
                ncell = (REF_LONG)l2c;
                if ((double)pRVar23 <= (double)pRVar2) {
                  pRVar23 = pRVar2;
                  nnode = (REF_GLOB)pRVar2;
                }
              }
              pdVar12 = (double *)((long)pdVar12 + local_1560);
            }
            uVar5 = ref_mpi_min(pRVar14,&l2c,&ncell,3);
            if (uVar5 != 0) {
              sStackY_1640 = (size_t)uVar5;
              pcVar18 = "mpi min";
              uVar9 = 0x1020;
              goto LAB_001a902f;
            }
            l2c = (REF_GLOB *)nnode;
            uVar5 = ref_mpi_max(pRVar14,&l2c,&nnode,3);
            if (uVar5 != 0) {
              sStackY_1640 = (size_t)uVar5;
              pcVar18 = "mpi max";
              uVar9 = 0x1022;
              goto LAB_001a902f;
            }
            if (pRVar14->id == 0) {
              sVar7 = fwrite(&ncell,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "mindata";
                uVar9 = 0x1024;
                goto LAB_001a9bb4;
              }
              sVar7 = fwrite(&nnode,8,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "maxdata";
                uVar9 = 0x1025;
                goto LAB_001a9bb4;
              }
            }
            local_1580 = local_1580 + 1;
          }
          if (1 < pRVar14->timing) {
            ref_mpi_stopwatch_stop(pRVar14,"plt tet min/max");
          }
          uVar5 = ref_gather_node_tec_block
                            (pRVar3,zonename._0_8_,(REF_GLOB *)solutiontime,(REF_INT)local_15b0,
                             local_15e0,(int)zonemarker,(FILE *)__s);
          if (uVar5 == 0) {
            if (1 < pRVar14->timing) {
              ref_mpi_stopwatch_stop(pRVar14,"plt tet node");
            }
            uVar5 = ref_gather_cell_tec(pRVar3,pRVar4,default_name._0_8_,(REF_GLOB *)solutiontime,1,
                                        (FILE *)__s);
            if (uVar5 == 0) {
              if (1 < pRVar14->timing) {
                ref_mpi_stopwatch_stop(pRVar14,"plt tet cell");
              }
              goto LAB_001a9c07;
            }
            sStackY_1640 = (size_t)uVar5;
            pcVar18 = "c2n";
            uVar9 = 0x1032;
          }
          else {
            sStackY_1640 = (size_t)uVar5;
            pcVar18 = "block points";
            uVar9 = 0x102d;
          }
          goto LAB_001a902f;
        }
        sVar7 = fwrite(&len_1,4,1,__s);
        if (sVar7 == 1) {
          local_1568 = (ulong)((int)local_1568 + 4);
          do {
            uVar5 = (int)local_1568 - 1;
            local_1568 = (ulong)uVar5;
            if (uVar5 == 0) {
              sVar7 = fwrite(&parentzone,4,1,__s);
              if (sVar7 != 1) {
                pcVar18 = "int";
                uVar9 = 0xfff;
                goto LAB_001a9bb4;
              }
              sVar7 = fwrite(&strandid,4,1,__s);
              if (sVar7 == 1) {
                sVar7 = fwrite(&notused,4,1,__s);
                if (sVar7 == 1) goto LAB_001a91de;
                pcVar18 = "int";
                uVar9 = 0x1001;
              }
              else {
                pcVar18 = "int";
                uVar9 = 0x1000;
              }
              goto LAB_001a9bb4;
            }
            sVar7 = fwrite(&zonemarker,4,1,__s);
          } while (sVar7 == 1);
          pcVar18 = "int";
          uVar9 = 0xffc;
        }
        else {
          pcVar18 = "zonemarker";
          uVar9 = 0xff9;
        }
LAB_001a9bb4:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tet_zone",pcVar18,1,sVar7);
        sStackY_1640 = 1;
      }
      else {
        sStackY_1640 = (size_t)uVar5;
        pcVar18 = "l2c";
        uVar9 = 0xff0;
LAB_001a902f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar9,"ref_gather_plt_tet_zone",sStackY_1640,pcVar18);
      }
      pcVar18 = "surf zone";
      uVar9 = 0x10f7;
    }
    else {
      uVar5 = ref_gather_plt_brick_zone
                        (local_15d8,local_15d8->cell[8],(REF_INT)local_15b0,local_15e0,(FILE *)__s);
      if (uVar5 != 0) {
        sStackY_1640 = (size_t)uVar5;
        pcVar18 = "plt tet brick zone";
        uVar9 = 0x10f5;
        goto LAB_001a698d;
      }
LAB_001a9c11:
      uVar5 = ref_gather_plt_brick_zone
                        (local_15d8,local_15d8->cell[9],(REF_INT)local_15b0,local_15e0,(FILE *)__s);
      if (uVar5 == 0) {
        uVar5 = ref_gather_plt_brick_zone
                          (local_15d8,local_15d8->cell[10],(REF_INT)local_15b0,local_15e0,
                           (FILE *)__s);
        if (uVar5 == 0) {
          uVar5 = ref_gather_plt_brick_zone
                            (local_15d8,local_15d8->cell[0xb],(REF_INT)local_15b0,local_15e0,
                             (FILE *)__s);
          if (uVar5 == 0) {
            if (0 < local_1590->timing) {
              ref_mpi_stopwatch_stop(local_1590,"vol zone");
            }
            if (local_1590->id != 0) {
              return 0;
            }
            fclose(__s);
            return 0;
          }
          sStackY_1640 = (size_t)uVar5;
          pcVar18 = "plt hex brick zone";
          uVar9 = 0x1101;
        }
        else {
          sStackY_1640 = (size_t)uVar5;
          pcVar18 = "plt pri brick zone";
          uVar9 = 0x10fe;
        }
      }
      else {
        sStackY_1640 = (size_t)uVar5;
        pcVar18 = "plt pyr brick zone";
        uVar9 = 0x10fb;
      }
    }
    goto LAB_001a698d;
  }
  pRVar17 = local_15d8->mpi;
  len_1 = -1;
  zonemarker = -NAN;
  zonename[0] = '\0';
  zonename[1] = '\0';
  zonename[2] = '\0';
  zonename[3] = '\0';
  zonename[4] = '\0';
  zonename[5] = '\0';
  zonename[6] = '\0';
  zonename[7] = '\0';
  parentzone = -1;
  notused = 0;
  zonetype = 0;
  datapacking = 0;
  l2c = (REF_GLOB *)CONCAT44(l2c._4_4_,0x43958000);
  numpts = 0;
  numelements = 0;
  strandid = 4;
  uVar5 = ref_grid_compact_cell_nodes
                    (local_15d8,local_15d8->cell[8],&ncell,(REF_LONG *)&solutiontime,
                     (REF_GLOB **)&nnode);
  if (uVar5 == 0) {
    if ((long)solutiontime < 1 || ncell < 1) {
LAB_001a772b:
      free((void *)nnode);
      goto LAB_001a773a;
    }
    if ((ulong)ncell < 0x80000000) {
      varloc = (int)ncell;
      if (0x7fffffff < (ulong)solutiontime) {
        pcVar18 = "too many tets for int";
        uVar9 = 0xec6;
        goto LAB_001a8062;
      }
      faceneighbors = SUB84(solutiontime,0);
      if (pRVar17->id != 0) goto LAB_001a772b;
      sVar7 = fwrite(&l2c,4,1,__s);
      if (sVar7 == 1) {
        default_name[0] = 'e';
        default_name[1] = '\0';
        default_name[2] = '\0';
        default_name[3] = '\0';
        default_name[4] = '4';
        default_name[5] = '\0';
        default_name[6] = '\0';
        default_name[7] = '\0';
        default_name[8] = '\0';
        default_name[9] = '\0';
        default_name[10] = '\0';
        default_name[0xb] = '\0';
        sVar7 = fwrite(default_name,4,3,__s);
        if (sVar7 == 3) {
          sVar7 = fwrite(&len_1,4,1,__s);
          if (sVar7 == 1) {
            sVar7 = fwrite(&zonemarker,4,1,__s);
            if (sVar7 == 1) {
              sVar7 = fwrite(zonename,8,1,__s);
              if (sVar7 == 1) {
                sVar7 = fwrite(&parentzone,4,1,__s);
                if (sVar7 == 1) {
                  sVar7 = fwrite(&strandid,4,1,__s);
                  if (sVar7 == 1) {
                    sVar7 = fwrite(&notused,4,1,__s);
                    if (sVar7 == 1) {
                      sVar7 = fwrite(&zonetype,4,1,__s);
                      if (sVar7 == 1) {
                        sVar7 = fwrite(&datapacking,4,1,__s);
                        if (sVar7 == 1) {
                          sVar7 = fwrite(&varloc,4,1,__s);
                          if (sVar7 == 1) {
                            sVar7 = fwrite(&faceneighbors,4,1,__s);
                            if (sVar7 == 1) {
                              sVar7 = fwrite(&numpts,4,1,__s);
                              if (sVar7 == 1) {
                                sVar7 = fwrite(&numpts,4,1,__s);
                                if (sVar7 == 1) {
                                  sVar7 = fwrite(&numpts,4,1,__s);
                                  if (sVar7 == 1) {
                                    sVar7 = fwrite(&numelements,4,1,__s);
                                    pRVar14 = local_1590;
                                    ref_grid_00 = local_15d8;
                                    if (sVar7 == 1) goto LAB_001a772b;
                                    pcVar18 = "int";
                                    uVar9 = 1;
                                    uVar10 = 0xede;
                                  }
                                  else {
                                    pcVar18 = "int";
                                    uVar9 = 1;
                                    uVar10 = 0xedd;
                                  }
                                }
                                else {
                                  pcVar18 = "int";
                                  uVar9 = 1;
                                  uVar10 = 0xedc;
                                }
                              }
                              else {
                                pcVar18 = "int";
                                uVar9 = 1;
                                uVar10 = 0xedb;
                              }
                            }
                            else {
                              pcVar18 = "int";
                              uVar9 = 1;
                              uVar10 = 0xeda;
                            }
                          }
                          else {
                            pcVar18 = "int";
                            uVar9 = 1;
                            uVar10 = 0xed9;
                          }
                        }
                        else {
                          pcVar18 = "int";
                          uVar9 = 1;
                          uVar10 = 0xed8;
                        }
                      }
                      else {
                        pcVar18 = "int";
                        uVar9 = 1;
                        uVar10 = 0xed7;
                      }
                    }
                    else {
                      pcVar18 = "int";
                      uVar9 = 1;
                      uVar10 = 0xed6;
                    }
                  }
                  else {
                    pcVar18 = "int";
                    uVar9 = 1;
                    uVar10 = 0xed5;
                  }
                }
                else {
                  pcVar18 = "int";
                  uVar9 = 1;
                  uVar10 = 0xed4;
                }
              }
              else {
                pcVar18 = "double";
                uVar9 = 1;
                uVar10 = 0xed3;
              }
            }
            else {
              pcVar18 = "int";
              uVar9 = 1;
              uVar10 = 0xed2;
            }
          }
          else {
            pcVar18 = "int";
            uVar9 = 1;
            uVar10 = 0xed1;
          }
        }
        else {
          pcVar18 = "title";
          uVar9 = 3;
          uVar10 = 0xecf;
        }
      }
      else {
        pcVar18 = "zonemarker";
        uVar9 = 1;
        uVar10 = 0xeca;
      }
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_plt_tet_header",pcVar18,uVar9,sVar7);
    }
    else {
      pcVar18 = "too many nodes for int";
      uVar9 = 0xec4;
LAB_001a8062:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_plt_tet_header",pcVar18);
    }
    sStackY_1640 = 1;
  }
  else {
    sStackY_1640 = (size_t)uVar5;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xebe,
           "ref_gather_plt_tet_header",(ulong)uVar5,"l2c");
  }
  pcVar18 = "plt tet header";
  uVar9 = 0x10d9;
LAB_001a698d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
         "ref_gather_scalar_plt",sStackY_1640,pcVar18);
  return (REF_STATUS)sStackY_1640;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_plt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char **scalar_names,
                                                REF_BOOL as_brick,
                                                const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file = NULL;
  int one = 1;
  int filetype = 0;
  int ascii[1024];
  int i, len, numvar = 3 + ldim;
  float eohmarker = 357.0;
  REF_INT cell_id, min_faceid, max_faceid;

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "reset timing");

  RSS(ref_node_synchronize_globals(ref_node), "sync");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header sync global");

  if (ref_mpi_once(ref_mpi)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(8, fwrite(&"#!TDV112", sizeof(char), 8, file), "header");
    REIS(1, fwrite(&one, sizeof(int), 1, file), "magic");
    REIS(1, fwrite(&filetype, sizeof(int), 1, file), "filetype");

    ascii[0] = (int)'f';
    ascii[1] = (int)'t';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&numvar, sizeof(int), 1, file), "numvar");
    ascii[0] = (int)'x';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'y';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    ascii[0] = (int)'z';
    ascii[1] = 0;
    REIS(2, fwrite(&ascii, sizeof(int), 2, file), "var");
    for (i = 0; i < ldim; i++) {
      len = 0;
      if (NULL == scalar_names) {
        char default_name[1000];
        snprintf(default_name, 1000, "V%d", i + 1);
        RSS(ref_gather_plt_char_int(default_name, 1024, &len, ascii), "a2i");
      } else {
        RSS(ref_gather_plt_char_int(scalar_names[i], 1024, &len, ascii), "a2i");
      }
      REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "var");
    }
  }

  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vars");
  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header faceid range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_header(ref_grid, cell_id, file), "plt tri header");
    RSS(ref_gather_plt_qua_header(ref_grid, cell_id, file), "plt qua header");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header surf");
  if (as_brick) {
    RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_tet(ref_grid), file),
        "plt tet brick header");
  } else {
    RSS(ref_gather_plt_tet_header(ref_grid, file), "plt tet header");
  }
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pyr(ref_grid), file),
      "plt pyr brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_pri(ref_grid), file),
      "plt pri brick header");
  RSS(ref_gather_plt_brick_header(ref_grid, ref_grid_hex(ref_grid), file),
      "plt hex brick header");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "header vol");

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&eohmarker, sizeof(float), 1, file), "eohmarker");
  }
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "plt end of header");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    RSS(ref_gather_plt_tri_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt tri zone");
    RSS(ref_gather_plt_qua_zone(ref_grid, cell_id, ldim, scalar, file),
        "plt qua zone");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "surf zone");

  if (as_brick) {
    RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_tet(ref_grid), ldim,
                                  scalar, file),
        "plt tet brick zone");
  } else {
    RSS(ref_gather_plt_tet_zone(ref_grid, ldim, scalar, file), "surf zone");
  }
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pyr(ref_grid), ldim, scalar,
                                file),
      "plt pyr brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_pri(ref_grid), ldim, scalar,
                                file),
      "plt pri brick zone");
  RSS(ref_gather_plt_brick_zone(ref_grid, ref_grid_hex(ref_grid), ldim, scalar,
                                file),
      "plt hex brick zone");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "vol zone");

  if (ref_mpi_once(ref_mpi)) {
    fclose(file);
  }

  return REF_SUCCESS;
}